

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subbreak2.cpp
# Opt level: O3

TProb Cipher::calcScore0(TParameters *params,TFreqMap *freqMap,TClusters *txt,
                        TClusterToLetterMap *clMap)

{
  float fVar1;
  char cVar2;
  long lVar3;
  double dVar4;
  uint uVar5;
  uint *puVar6;
  undefined4 *puVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  int iVar14;
  TProb TVar15;
  long lVar16;
  float fVar17;
  double dVar18;
  float fVar19;
  vector<int,_std::allocator<int>_> plain;
  array<int,_27UL> letCount;
  allocator_type local_d1;
  TProb local_d0;
  TFreqMap *local_c8;
  vector<int,_std::allocator<int>_> local_c0;
  int local_a8 [30];
  
  TVar15 = (TProb)((ulong)((long)(txt->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                 super__Vector_impl_data._M_finish -
                          (long)(txt->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                super__Vector_impl_data._M_start) >> 2);
  local_a8[0x18] = 0;
  local_a8[0x19] = 0;
  local_a8[0x1a] = 0;
  local_a8[0x14] = 0;
  local_a8[0x15] = 0;
  local_a8[0x16] = 0;
  local_a8[0x17] = 0;
  local_a8[0x10] = 0;
  local_a8[0x11] = 0;
  local_a8[0x12] = 0;
  local_a8[0x13] = 0;
  local_a8[0xc] = 0;
  local_a8[0xd] = 0;
  local_a8[0xe] = 0;
  local_a8[0xf] = 0;
  local_a8[8] = 0;
  local_a8[9] = 0;
  local_a8[10] = 0;
  local_a8[0xb] = 0;
  local_a8[4] = 0;
  local_a8[5] = 0;
  local_a8[6] = 0;
  local_a8[7] = 0;
  local_a8[0] = 0;
  local_a8[1] = 0;
  local_a8[2] = 0;
  local_a8[3] = 0;
  uVar9 = SUB84(TVar15,0);
  std::vector<int,_std::allocator<int>_>::vector(&local_c0,(long)(int)uVar9,&local_d1);
  fVar19 = 0.0;
  if (0 < (int)uVar9) {
    uVar13 = (ulong)(uVar9 & 0x7fffffff);
    lVar16 = 0;
    iVar10 = 0;
    local_d0 = TVar15;
    local_c8 = freqMap;
    do {
      puVar6 = (uint *)std::
                       map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                       at(clMap,(key_type_conflict *)
                                ((long)(txt->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                       super__Vector_impl_data._M_start + lVar16));
      uVar9 = *puVar6;
      *(uint *)((long)local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start + lVar16) = uVar9;
      if (uVar9 - 1 < 0x1a) {
        local_a8[uVar9] = local_a8[uVar9] + 1;
LAB_0013e130:
        iVar10 = iVar10 + 1;
      }
      else if (params->includeSpaces == true) {
        local_a8[0] = local_a8[0] + 1;
        goto LAB_0013e130;
      }
      lVar16 = lVar16 + 4;
      uVar13 = uVar13 - 1;
    } while (uVar13 != 0);
    fVar19 = (float)iVar10;
    freqMap = local_c8;
    TVar15 = local_d0;
  }
  fVar17 = 0.0;
  puVar7 = &(anonymous_namespace)::kEnglishLetterFreq;
  if (params->includeSpaces != false) {
    puVar7 = &(anonymous_namespace)::kEnglishLetterWithSpacesFreq;
  }
  lVar16 = 0;
  do {
    fVar1 = (float)puVar7[lVar16] * 0.01 - (float)local_a8[lVar16] / fVar19;
    fVar17 = fVar17 + fVar1 * fVar1;
    lVar16 = lVar16 + 1;
  } while (lVar16 != 0x1b);
  fVar17 = fVar17 / 27.0;
  if (fVar17 < 0.0) {
    fVar17 = sqrtf(fVar17);
  }
  else {
    fVar17 = SQRT(fVar17);
  }
  iVar10 = freqMap->len;
  cVar2 = (char)iVar10;
  uVar13 = 0;
  iVar14 = SUB84(TVar15,0);
  if (iVar10 < 1) {
    dVar18 = 0.0;
    uVar9 = 0;
  }
  else {
    uVar11 = 0;
    if (0 < iVar14) {
      uVar11 = (ulong)TVar15 & 0xffffffff;
    }
    dVar18 = 0.0;
    local_d0 = -1e+100;
    uVar9 = 0;
    do {
      if (uVar11 == uVar13) {
LAB_0013e2b0:
        if (local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0) {
          operator_delete(local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        return local_d0;
      }
      uVar12 = local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar13] - 1;
      uVar5 = uVar9 * 0x20 +
              local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[uVar13];
      if (0x19 < uVar12) {
        dVar18 = dVar18 + params->pNonAlphabetic;
        uVar5 = uVar9;
      }
      uVar9 = uVar5;
      uVar13 = uVar13 + 1;
      iVar10 = iVar10 - (uint)(uVar12 < 0x1a);
    } while (iVar10 != 0);
  }
  do {
    iVar8 = (int)uVar13;
    iVar10 = iVar14;
    if (iVar14 < iVar8) {
      iVar10 = iVar8;
    }
    lVar16 = 0;
    dVar4 = dVar18 + (freqMap->prob).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[(int)uVar9];
    do {
      dVar18 = dVar4;
      if ((long)iVar10 - (long)iVar8 == lVar16) {
        local_d0 = dVar18 / (double)iVar14 - (double)(fVar17 * params->wEnglishFreq);
        goto LAB_0013e2b0;
      }
      lVar3 = iVar8 + lVar16;
      lVar16 = lVar16 + 1;
      dVar4 = dVar18 + params->pNonAlphabetic;
    } while (0x19 < local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar3] - 1U);
    uVar13 = (ulong)(uint)(iVar8 + (int)lVar16);
    uVar9 = local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar3] | (uVar9 & ~(-1 << (cVar2 * '\x05' - 5U & 0x1f))) << 5;
  } while( true );
}

Assistant:

TProb calcScore0(const TParameters & params, const TFreqMap & freqMap, const TClusters & txt, const TClusterToLetterMap & clMap) {
        const int n = txt.size();
        const auto & len  = freqMap.len;
        const auto & prob = freqMap.prob;

        int nlet = 0;
        std::array<int, 27> letCount;
        letCount.fill(0);
        std::vector<TLetter> plain(n);
        for (int i = 0; i < n; ++i) {
            plain[i] = clMap.at(txt[i]);
            if (plain[i] > 0 && plain[i] <= 26) {
                ++letCount[plain[i]];
                ++nlet;
            } else if (params.includeSpaces) {
                ++letCount[0];
                ++nlet;
            }
        }

        float letFreqCost = 0.0;
        {
            auto & freq = params.includeSpaces ? kEnglishLetterWithSpacesFreq : kEnglishLetterFreq;
            for (int i = 0; i < 27; ++i) {
                float curf = 0.01*freq[i] - ((float)(letCount[i]))/((float)(nlet));
                letFreqCost += curf*curf;
            }
        }

        letFreqCost /= 27.0;
        letFreqCost = sqrt(letFreqCost);
        //printf("letFreqCost = %g\n", letFreqCost);

        int i1 = 0;
        int k = len;
        TCode curc = 0;
        TCode mask = (1 << 5*(len-1)) - 1;

        TProb res = 0.0;

        while (k > 0) {
            if (i1 >= n) return -1e100;
            auto c = plain[i1++];
            if (c > 0 && c <= 26) {
                curc <<= 5;
                curc += c;
                --k;
            } else {
                res += params.pNonAlphabetic;
            }
        }

        res += prob[curc];
        while (true) {
            curc &= mask;

            while (true) {
                if (i1 >= n) return res/n - params.wEnglishFreq*letFreqCost;
                auto c = plain[i1++];
                if (c > 0 && c <= 26) {
                    curc <<= 5;
                    curc += c;
                    break;
                } else {
                    res += params.pNonAlphabetic;
                }
            }

            res += prob[curc];
        }

        return res/n - params.wEnglishFreq*letFreqCost;
    }